

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

void __thiscall
duckdb::BlockIndexManager::BlockIndexManager(BlockIndexManager *this,TemporaryFileManager *manager)

{
  _Rb_tree_header *p_Var1;
  
  this->max_index = 0;
  p_Var1 = &(this->free_indexes)._M_t._M_impl.super__Rb_tree_header;
  (this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header;
  (this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->manager).ptr = manager;
  return;
}

Assistant:

BlockIndexManager::BlockIndexManager(TemporaryFileManager &manager) : max_index(0), manager(&manager) {
}